

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrittenFontCFF.cpp
# Opt level: O0

EStatusCode __thiscall WrittenFontCFF::WriteFontDefinition(WrittenFontCFF *this,bool inEmbedFont)

{
  bool bVar1;
  Trace *pTVar2;
  undefined1 local_88 [8];
  CFFDescendentFontWriter descendentFontWriter;
  CIDFontWriter fontWriter_1;
  undefined1 local_30 [8];
  CFFANSIFontWriter fontWriter;
  EStatusCode status;
  bool inEmbedFont_local;
  WrittenFontCFF *this_local;
  
  fontWriter.mEmbeddedFontFileObjectID._0_4_ = eSuccess;
  fontWriter.mEmbeddedFontFileObjectID._7_1_ = inEmbedFont;
  if ((((this->super_AbstractWrittenFont).mANSIRepresentation != (WrittenFontRepresentation *)0x0)
      && (bVar1 = WrittenFontRepresentation::isEmpty
                            ((this->super_AbstractWrittenFont).mANSIRepresentation), !bVar1)) &&
     (((this->super_AbstractWrittenFont).mANSIRepresentation)->mWrittenObjectID != 0)) {
    CFFANSIFontWriter::CFFANSIFontWriter((CFFANSIFontWriter *)local_30);
    fontWriter.mEmbeddedFontFileObjectID._0_4_ =
         CFFANSIFontWriter::WriteFont
                   ((CFFANSIFontWriter *)local_30,(this->super_AbstractWrittenFont).mFontInfo,
                    (this->super_AbstractWrittenFont).mANSIRepresentation,
                    (this->super_AbstractWrittenFont).mObjectsContext,
                    (bool)(fontWriter.mEmbeddedFontFileObjectID._7_1_ & 1));
    bVar1 = (EStatusCode)fontWriter.mEmbeddedFontFileObjectID != eSuccess;
    if (bVar1) {
      pTVar2 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar2,
                        "WrittenFontCFF::WriteFontDefinition, Failed to write Ansi font definition")
      ;
    }
    CFFANSIFontWriter::~CFFANSIFontWriter((CFFANSIFontWriter *)local_30);
    if (bVar1) {
      return (EStatusCode)fontWriter.mEmbeddedFontFileObjectID;
    }
  }
  if ((((this->super_AbstractWrittenFont).mCIDRepresentation != (WrittenFontRepresentation *)0x0) &&
      (bVar1 = WrittenFontRepresentation::isEmpty
                         ((this->super_AbstractWrittenFont).mCIDRepresentation), !bVar1)) &&
     (((this->super_AbstractWrittenFont).mCIDRepresentation)->mWrittenObjectID != 0)) {
    CIDFontWriter::CIDFontWriter((CIDFontWriter *)&descendentFontWriter.mEmbeddedFontFileObjectID);
    CFFDescendentFontWriter::CFFDescendentFontWriter((CFFDescendentFontWriter *)local_88);
    fontWriter.mEmbeddedFontFileObjectID._0_4_ =
         CIDFontWriter::WriteFont
                   ((CIDFontWriter *)&descendentFontWriter.mEmbeddedFontFileObjectID,
                    (this->super_AbstractWrittenFont).mFontInfo,
                    (this->super_AbstractWrittenFont).mCIDRepresentation,
                    (this->super_AbstractWrittenFont).mObjectsContext,
                    (IDescendentFontWriter *)local_88,
                    (bool)(fontWriter.mEmbeddedFontFileObjectID._7_1_ & 1));
    if ((EStatusCode)fontWriter.mEmbeddedFontFileObjectID != eSuccess) {
      pTVar2 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar2,
                        "WrittenFontCFF::WriteFontDefinition, Failed to write CID font definition");
    }
    CFFDescendentFontWriter::~CFFDescendentFontWriter((CFFDescendentFontWriter *)local_88);
    CIDFontWriter::~CIDFontWriter((CIDFontWriter *)&descendentFontWriter.mEmbeddedFontFileObjectID);
  }
  return (EStatusCode)fontWriter.mEmbeddedFontFileObjectID;
}

Assistant:

EStatusCode WrittenFontCFF::WriteFontDefinition(bool inEmbedFont)
{
	EStatusCode status = PDFHummus::eSuccess;
	do
	{
		if(mANSIRepresentation && !mANSIRepresentation->isEmpty() && mANSIRepresentation->mWrittenObjectID != 0)
		{
			CFFANSIFontWriter fontWriter;

			status = fontWriter.WriteFont(*mFontInfo, mANSIRepresentation, mObjectsContext, inEmbedFont);
			if(status != PDFHummus::eSuccess)
			{
				TRACE_LOG("WrittenFontCFF::WriteFontDefinition, Failed to write Ansi font definition");
				break;

			}
		}

		if(mCIDRepresentation && !mCIDRepresentation->isEmpty()  && mCIDRepresentation->mWrittenObjectID != 0)
		{
			CIDFontWriter fontWriter;
			CFFDescendentFontWriter descendentFontWriter;

			status = fontWriter.WriteFont(*mFontInfo, mCIDRepresentation, mObjectsContext, &descendentFontWriter, inEmbedFont);
			if(status != PDFHummus::eSuccess)
			{
				TRACE_LOG("WrittenFontCFF::WriteFontDefinition, Failed to write CID font definition");
				break;
			}
		}

	} while(false);

	return status;
}